

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

void __thiscall
camp::PropertyNotFound::PropertyNotFound(PropertyNotFound *this,PropertyNotFound *param_1)

{
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__Error_00141618;
  return;
}

Assistant:

class CAMP_API PropertyNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param name Name of the requested property
     * \param className Name of the owner metaclass
     */
    PropertyNotFound(const std::string& name, const std::string& className);
}